

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

bool google::protobuf::internal::ReflectionOps::IsInitialized(Message *message)

{
  long lVar1;
  FieldDescriptor *this;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  CppType CVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Descriptor *pDVar8;
  MapFieldBase *this_00;
  Message *pMVar9;
  long *plVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  MapIterator iter;
  MapIterator end;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_a8;
  MapIterator local_90;
  MapIterator local_60;
  long *plVar7;
  
  iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])();
  iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  plVar7 = (long *)CONCAT44(extraout_var_00,iVar5);
  lVar13 = 0;
  for (lVar14 = 0; lVar14 < *(int *)(CONCAT44(extraout_var,iVar4) + 0x2c); lVar14 = lVar14 + 1) {
    lVar1 = *(long *)(CONCAT44(extraout_var,iVar4) + 0x30);
    if ((*(int *)(lVar1 + 0x4c + lVar13) == 2) &&
       (cVar2 = (**(code **)(*plVar7 + 0x28))(plVar7,message,lVar1 + lVar13), cVar2 == '\0')) {
      return false;
    }
    lVar13 = lVar13 + 0xa8;
  }
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*plVar7 + 0x80))(plVar7,message);
  for (uVar12 = 0;
      uVar11 = (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
               (long)local_a8._M_impl.super__Vector_impl_data._M_start >> 3, uVar12 < uVar11;
      uVar12 = uVar12 + 1) {
    this = local_a8._M_impl.super__Vector_impl_data._M_start[uVar12];
    CVar6 = FieldDescriptor::cpp_type(this);
    if (CVar6 == CPPTYPE_MESSAGE) {
      bVar3 = FieldDescriptor::is_map(this);
      if (bVar3) {
        pDVar8 = FieldDescriptor::message_type(this);
        CVar6 = FieldDescriptor::cpp_type((FieldDescriptor *)(*(long *)(pDVar8 + 0x30) + 0xa8));
        if (CVar6 == CPPTYPE_MESSAGE) {
          this_00 = (MapFieldBase *)(**(code **)(*plVar7 + 0x2d8))(plVar7,message,this);
          bVar3 = MapFieldBase::IsMapValid(this_00);
          if (!bVar3) goto LAB_0032a0bc;
          MapIterator::MapIterator(&local_90,message,this);
          MapIterator::MapIterator(&local_60,message,this);
          (*this_00->_vptr_MapFieldBase[6])(this_00,&local_90);
          (*this_00->_vptr_MapFieldBase[7])(this_00,&local_60);
          while (iVar4 = (*(local_90.map_)->_vptr_MapFieldBase[5])
                                   (local_90.map_,&local_90,&local_60), (char)iVar4 == '\0') {
            pMVar9 = MapValueRef::GetMessageValue(&local_90.value_);
            iVar4 = (*(pMVar9->super_MessageLite)._vptr_MessageLite[8])(pMVar9);
            if ((char)iVar4 == '\0') {
              MapIterator::~MapIterator(&local_60);
              MapIterator::~MapIterator(&local_90);
              goto LAB_0032a15a;
            }
            (*(local_90.map_)->_vptr_MapFieldBase[0xf])(local_90.map_,&local_90);
          }
          MapIterator::~MapIterator(&local_60);
          MapIterator::~MapIterator(&local_90);
        }
      }
      else {
LAB_0032a0bc:
        if (*(int *)(this + 0x4c) == 3) {
          iVar4 = (**(code **)(*plVar7 + 0x30))(plVar7,message,this);
          iVar5 = 0;
          if (iVar4 < 1) {
            iVar4 = iVar5;
          }
          while (iVar4 != iVar5) {
            plVar10 = (long *)(**(code **)(*plVar7 + 0x1a0))(plVar7,message,this,iVar5);
            cVar2 = (**(code **)(*plVar10 + 0x40))(plVar10);
            iVar5 = iVar5 + 1;
            if (cVar2 == '\0') goto LAB_0032a15a;
          }
        }
        else {
          plVar10 = (long *)(**(code **)(*plVar7 + 0xd8))(plVar7,message,this,0);
          cVar2 = (**(code **)(*plVar10 + 0x40))(plVar10);
          if (cVar2 == '\0') break;
        }
      }
    }
  }
LAB_0032a15a:
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&local_a8);
  return uVar11 <= uVar12;
}

Assistant:

bool ReflectionOps::IsInitialized(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = message.GetReflection();

  // Check required fields of this message.
  for (int i = 0; i < descriptor->field_count(); i++) {
    if (descriptor->field(i)->is_required()) {
      if (!reflection->HasField(message, descriptor->field(i))) {
        return false;
      }
    }
  }

  // Check that sub-messages are initialized.
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {

      if (field->is_map()) {
        const FieldDescriptor* value_field = field->message_type()->field(1);
        if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          MapFieldBase* map_field =
              reflection->MapData(const_cast<Message*>(&message), field);
          if (map_field->IsMapValid()) {
            MapIterator iter(const_cast<Message*>(&message), field);
            MapIterator end(const_cast<Message*>(&message), field);
            for (map_field->MapBegin(&iter), map_field->MapEnd(&end);
                 iter != end; ++iter) {
              if (!iter.GetValueRef().GetMessageValue().IsInitialized()) {
                return false;
              }
            }
            continue;
          }
        } else {
          continue;
        }
      }

      if (field->is_repeated()) {
        int size = reflection->FieldSize(message, field);

        for (int j = 0; j < size; j++) {
          if (!reflection->GetRepeatedMessage(message, field, j)
                          .IsInitialized()) {
            return false;
          }
        }
      } else {
        if (!reflection->GetMessage(message, field).IsInitialized()) {
          return false;
        }
      }
    }
  }

  return true;
}